

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.h
# Opt level: O0

void __thiscall libwebm::Webm2Pes::~Webm2Pes(Webm2Pes *this)

{
  Webm2Pes *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->packet_data_);
  std::unique_ptr<_IO_FILE,_libwebm::FILEDeleter>::~unique_ptr(&this->output_file_);
  mkvparser::MkvReader::~MkvReader(&this->webm_reader_);
  std::unique_ptr<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::~unique_ptr
            (&this->webm_parser_);
  std::__cxx11::string::~string((string *)&this->output_file_name_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Webm2Pes() = default;